

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerQueue.cpp
# Opt level: O0

void mario::detail::resetTimerfd(int timerfd,Timestamp expiration)

{
  Writer *this;
  Writer local_f0;
  int local_74;
  Timestamp TStack_70;
  int ret;
  timespec local_68;
  undefined1 local_58 [8];
  itimerspec oldValue;
  itimerspec newValue;
  int timerfd_local;
  Timestamp expiration_local;
  
  memset(&oldValue.it_value.tv_nsec,0,0x20);
  memset(local_58,0,0x20);
  TStack_70._microSecondsSinceEpoch = expiration._microSecondsSinceEpoch;
  local_68 = howMuchTimeFromNow(expiration);
  local_74 = timerfd_settime(timerfd,0,(itimerspec *)&oldValue.it_value.tv_nsec,
                             (itimerspec *)local_58);
  if (local_74 != 0) {
    el::base::Writer::Writer
              (&local_f0,Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/yichenluan[P]Mario/mario/net/TimerQueue.cpp"
               ,0x3d,"void mario::detail::resetTimerfd(int, Timestamp)",NormalLog,0);
    this = el::base::Writer::construct(&local_f0,1,el::base::consts::kDefaultLoggerId);
    el::base::Writer::operator<<(this,(char (*) [18])"timerfd_settime()");
    el::base::Writer::~Writer(&local_f0);
  }
  return;
}

Assistant:

void resetTimerfd(int timerfd, Timestamp expiration) {
    struct itimerspec newValue;
    struct itimerspec oldValue;
    bzero(&newValue, sizeof(newValue));
    bzero(&oldValue, sizeof(oldValue));

    newValue.it_value = howMuchTimeFromNow(expiration);
    int ret = ::timerfd_settime(timerfd, 0, &newValue, &oldValue);
    if (ret) {
        LOG(FATAL) << "timerfd_settime()";
    }
}